

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFontConfig *pIVar1;
  void *ptr;
  ImFont **ppIVar2;
  ImFont *pIVar3;
  ImFontConfig *pIVar4;
  ImFontAtlasCustomRect *ptr_00;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (this->Locked != false) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                  ,0x712,"void ImFontAtlas::ClearInputData()");
  }
  iVar6 = (this->ConfigData).Size;
  if (0 < iVar6) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pIVar1 = (this->ConfigData).Data;
      ptr = *(void **)(pIVar1->Name + lVar7 + -0x56);
      if ((ptr != (void *)0x0) && (pIVar1->Name[lVar7 + -0x4a] == '\x01')) {
        ImGui::MemFree(ptr);
        if ((this->ConfigData).Size <= lVar8) {
          pcVar5 = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
          goto LAB_00145dc9;
        }
        pcVar5 = ((this->ConfigData).Data)->Name + lVar7 + -0x56;
        pcVar5[0] = '\0';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        pcVar5[3] = '\0';
        pcVar5[4] = '\0';
        pcVar5[5] = '\0';
        pcVar5[6] = '\0';
        pcVar5[7] = '\0';
      }
      lVar8 = lVar8 + 1;
      iVar6 = (this->ConfigData).Size;
      lVar7 = lVar7 + 0x88;
    } while (lVar8 < iVar6);
  }
  lVar7 = (long)(this->Fonts).Size;
  if (0 < lVar7) {
    ppIVar2 = (this->Fonts).Data;
    pIVar1 = (this->ConfigData).Data;
    lVar8 = 0;
    do {
      pIVar3 = ppIVar2[lVar8];
      pIVar4 = pIVar3->ConfigData;
      if ((pIVar1 <= pIVar4) && (pIVar4 < pIVar1 + iVar6)) {
        pIVar3->ConfigData = (ImFontConfig *)0x0;
        if ((this->Fonts).Size <= lVar8) {
          pcVar5 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00145dc9:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                        ,0x658,pcVar5);
        }
        ppIVar2[lVar8]->ConfigDataCount = 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  pIVar1 = (this->ConfigData).Data;
  if (pIVar1 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar1);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr_00 = (this->CustomRects).Data;
  if (ptr_00 != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
}